

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

wchar_t archive_read_format_zip_read_data_skip_streamable(archive_read *a)

{
  void **buff_00;
  int64_t iVar1;
  archive *in_RDI;
  ssize_t bytes_avail;
  char *buff_1;
  char *p;
  wchar_t r;
  size_t size;
  void *buff;
  int64_t offset;
  int64_t bytes_skipped;
  zip *zip;
  size_t in_stack_ffffffffffffffa8;
  archive_read *in_stack_ffffffffffffffb0;
  archive_read *local_48;
  archive_read *a_00;
  wchar_t local_4;
  
  a_00 = *(archive_read **)in_RDI[0x15].archive_format_name;
  buff_00 = (void **)__archive_read_consume(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  a_00->skip_file_ino = 0;
  if ((long)buff_00 < 0) {
    local_4 = L'\xffffffe2';
  }
  else if (*(char *)((long)&(a_00->client).opener + 2) == '\0') {
    if (((*(ushort *)(a_00->read_data_block + 0x7e) & 8) == 0) ||
       (0 < *(long *)(a_00->read_data_block + 0x28))) {
      iVar1 = __archive_read_consume(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      if (iVar1 < 0) {
        local_4 = L'\xffffffe2';
      }
      else {
        local_4 = L'\0';
      }
    }
    else if (a_00->read_data_block[0x80] == '\b') {
      do {
        if (*(char *)((long)&(a_00->client).opener + 2) != '\0') {
          return L'\0';
        }
        local_4 = zip_read_data_deflate(a_00,buff_00,(size_t *)0x0,(int64_t *)0x0);
      } while (local_4 == L'\0');
    }
    else {
      while (in_stack_ffffffffffffffb0 =
                  (archive_read *)
                  __archive_read_ahead
                            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(ssize_t *)0x168011
                            ), local_48 = in_stack_ffffffffffffffb0,
            0xf < (long)in_stack_ffffffffffffffa8) {
        while (local_48 <=
               (archive_read *)
               ((long)in_stack_ffffffffffffffb0 + (in_stack_ffffffffffffffa8 - 0x10))) {
          if (*(char *)((long)&(local_48->archive).magic + 3) == 'P') {
            local_48 = (archive_read *)((long)&(local_48->archive).magic + 3);
          }
          else if (*(char *)((long)&(local_48->archive).magic + 3) == 'K') {
            local_48 = (archive_read *)((long)&(local_48->archive).magic + 2);
          }
          else if (*(char *)((long)&(local_48->archive).magic + 3) == '\a') {
            local_48 = (archive_read *)((long)&(local_48->archive).magic + 1);
          }
          else {
            if ((((*(char *)((long)&(local_48->archive).magic + 3) == '\b') &&
                 (*(char *)((long)&(local_48->archive).magic + 2) == '\a')) &&
                (*(char *)((long)&(local_48->archive).magic + 1) == 'K')) &&
               ((char)(local_48->archive).magic == 'P')) {
              if ((a_00->read_data_block[0x82] & 1U) == 0) {
                __archive_read_consume(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
              }
              else {
                __archive_read_consume(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
              }
              return L'\0';
            }
            local_48 = (archive_read *)&(local_48->archive).state;
          }
        }
        __archive_read_consume(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      }
      archive_set_error(in_RDI,0x54,"Truncated ZIP file data");
      local_4 = L'\xffffffe2';
    }
  }
  else {
    local_4 = L'\0';
  }
  return local_4;
}

Assistant:

static int
archive_read_format_zip_read_data_skip_streamable(struct archive_read *a)
{
	struct zip *zip;
	int64_t bytes_skipped;

	zip = (struct zip *)(a->format->data);
	bytes_skipped = __archive_read_consume(a, zip->unconsumed);
	zip->unconsumed = 0;
	if (bytes_skipped < 0)
		return (ARCHIVE_FATAL);

	/* If we've already read to end of data, we're done. */
	if (zip->end_of_entry)
		return (ARCHIVE_OK);

	/* So we know we're streaming... */
	if (0 == (zip->entry->zip_flags & ZIP_LENGTH_AT_END)
	    || zip->entry->compressed_size > 0) {
		/* We know the compressed length, so we can just skip. */
		bytes_skipped = __archive_read_consume(a, zip->entry_bytes_remaining);
		if (bytes_skipped < 0)
			return (ARCHIVE_FATAL);
		return (ARCHIVE_OK);
	}

	/* We're streaming and we don't know the length. */
	/* If the body is compressed and we know the format, we can
	 * find an exact end-of-entry by decompressing it. */
	switch (zip->entry->compression) {
#ifdef HAVE_ZLIB_H
	case 8: /* Deflate compression. */
		while (!zip->end_of_entry) {
			int64_t offset = 0;
			const void *buff = NULL;
			size_t size = 0;
			int r;
			r =  zip_read_data_deflate(a, &buff, &size, &offset);
			if (r != ARCHIVE_OK)
				return (r);
		}
		return ARCHIVE_OK;
#endif
	default: /* Uncompressed or unknown. */
		/* Scan for a PK\007\010 signature. */
		for (;;) {
			const char *p, *buff;
			ssize_t bytes_avail;
			buff = __archive_read_ahead(a, 16, &bytes_avail);
			if (bytes_avail < 16) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Truncated ZIP file data");
				return (ARCHIVE_FATAL);
			}
			p = buff;
			while (p <= buff + bytes_avail - 16) {
				if (p[3] == 'P') { p += 3; }
				else if (p[3] == 'K') { p += 2; }
				else if (p[3] == '\007') { p += 1; }
				else if (p[3] == '\010' && p[2] == '\007'
				    && p[1] == 'K' && p[0] == 'P') {
					if (zip->entry->flags & LA_USED_ZIP64)
						__archive_read_consume(a, p - buff + 24);
					else
						__archive_read_consume(a, p - buff + 16);
					return ARCHIVE_OK;
				} else { p += 4; }
			}
			__archive_read_consume(a, p - buff);
		}
	}
}